

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_reader_init_stdfile(mpack_reader_t *reader,FILE *file,_Bool close_when_done)

{
  char *buffer_00;
  code *teardown;
  char *buffer;
  size_t capacity;
  _Bool close_when_done_local;
  FILE *file_local;
  mpack_reader_t *reader_local;
  
  buffer_00 = (char *)malloc(0x1000);
  if (buffer_00 == (char *)0x0) {
    mpack_reader_init_error(reader,mpack_error_memory);
    if (close_when_done) {
      fclose((FILE *)file);
    }
  }
  else {
    mpack_reader_init(reader,buffer_00,0x1000,0);
    mpack_reader_set_context(reader,file);
    mpack_reader_set_fill(reader,mpack_file_reader_fill);
    mpack_reader_set_skip(reader,mpack_file_reader_skip);
    teardown = mpack_file_reader_teardown;
    if (close_when_done) {
      teardown = mpack_file_reader_teardown_close;
    }
    mpack_reader_set_teardown(reader,teardown);
  }
  return;
}

Assistant:

void mpack_reader_init_stdfile(mpack_reader_t* reader, FILE* file, bool close_when_done) {
    mpack_assert(file != NULL, "file is NULL");

    size_t capacity = MPACK_BUFFER_SIZE;
    char* buffer = (char*)MPACK_MALLOC(capacity);
    if (buffer == NULL) {
        mpack_reader_init_error(reader, mpack_error_memory);
        if (close_when_done) {
            fclose(file);
        }
        return;
    }

    mpack_reader_init(reader, buffer, capacity, 0);
    mpack_reader_set_context(reader, file);
    mpack_reader_set_fill(reader, mpack_file_reader_fill);
    mpack_reader_set_skip(reader, mpack_file_reader_skip);
    mpack_reader_set_teardown(reader, close_when_done ?
            mpack_file_reader_teardown_close :
            mpack_file_reader_teardown);
}